

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O2

void __thiscall amrex::ClusterList::intersect(ClusterList *this,BoxArray *domba)

{
  Cluster *this_00;
  _List_node_base *p_Var1;
  bool bVar2;
  int __fdout;
  __off64_t *in_R8;
  size_t in_R9;
  _Self __tmp;
  const_iterator __position;
  BoxDomain bxdom;
  ClusterList clst;
  BoxDomain dom;
  
  BoxArray::removeOverlap(domba,true);
  BoxArray::boxList(&bxdom.super_BoxList,domba);
  BoxDomain::BoxDomain(&dom,&bxdom.super_BoxList);
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&bxdom);
  __position._M_node =
       (this->lst).super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  while (__position._M_node != (_List_node_base *)this) {
    this_00 = (Cluster *)__position._M_node[1]._M_next;
    bxdom.super_BoxList.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    bxdom.super_BoxList.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_4_ = 0;
    __fdout = (int)&bxdom;
    bVar2 = BoxArray::contains(domba,(Box *)this_00,true,(IntVect *)&bxdom);
    if (bVar2) {
      __position._M_node = (__position._M_node)->_M_next;
    }
    else {
      BoxDomain::BoxDomain(&bxdom);
      amrex::intersect(&bxdom,&dom,(Box *)this_00);
      if ((pointer)CONCAT44(bxdom.super_BoxList.m_lbox.
                            super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_finish._4_4_,
                            bxdom.super_BoxList.m_lbox.
                            super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_4_) !=
          bxdom.super_BoxList.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_start &&
          -1 < (long)CONCAT44(bxdom.super_BoxList.m_lbox.
                              super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_finish._4_4_,
                              bxdom.super_BoxList.m_lbox.
                              super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_finish._0_4_) -
               (long)bxdom.super_BoxList.m_lbox.
                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_start) {
        clst.lst.super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>._M_impl.
        _M_node._M_size = 0;
        clst.lst.super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>._M_impl.
        _M_node.super__List_node_base._M_next = (_List_node_base *)&clst;
        clst.lst.super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>._M_impl.
        _M_node.super__List_node_base._M_prev = (_List_node_base *)&clst;
        Cluster::distribute(this_00,&clst,&bxdom);
        std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::splice
                  (&this->lst,(int)this,(__off64_t *)&clst,__fdout,in_R8,in_R9,
                   (uint)bxdom.super_BoxList.m_lbox.
                         super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                         super__Vector_impl_data._M_start);
        ~ClusterList(&clst);
      }
      operator_delete(this_00,0x30);
      p_Var1 = (__position._M_node)->_M_next;
      std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::erase
                (&this->lst,__position);
      std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&bxdom);
      __position._M_node = p_Var1;
    }
  }
  BoxArray::clear(domba);
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&dom);
  return;
}

Assistant:

void
ClusterList::intersect (BoxArray& domba)
{
    BL_PROFILE("ClusterList::intersect()");

    domba.removeOverlap();

    BoxDomain dom(domba.boxList());

    for (std::list<Cluster*>::iterator cli = lst.begin(); cli != lst.end(); )
    {
        Cluster* c = *cli;

        bool assume_disjoint_ba = true;
        if (domba.contains(c->box(),assume_disjoint_ba))
        {
            ++cli;
        }
        else
        {
            BoxDomain bxdom;

            amrex::intersect(bxdom, dom, c->box());

            if (bxdom.size() > 0)
            {
                ClusterList clst;
                c->distribute(clst,bxdom);
                lst.splice(lst.end(),clst.lst);
            }
            //
            // Must explicitly delete c.
            //
            delete c;

            lst.erase(cli++);
        }
    }

    domba.clear();
}